

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O3

double __thiscall SAUF_BG<RemSP>::Alloc(SAUF_BG<RemSP> *this)

{
  Mat1b *pMVar1;
  int *piVar2;
  Mat1i *pMVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Mat local_70 [96];
  
  pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  dVar4 = RemSP::Alloc((int)((long)*(int *)&pMVar1->field_0xc + 1U >> 1) *
                       (*(int *)&pMVar1->field_0x8 + 1) + 1,
                       &(this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_);
  lVar7 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last =
       (double)lVar7;
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_)->field_0x40;
  cv::Mat::Mat(local_70,*piVar2,piVar2[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->super_Mat,
                     local_70);
  cv::Mat::~Mat(local_70);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  lVar7 = cv::getTickCount();
  dVar6 = (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.tick_frequency_;
  dVar8 = (double)lVar7 -
          (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last = dVar8;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total + dVar8
  ;
  lVar7 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last =
       (double)lVar7;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  lVar7 = cv::getTickCount();
  dVar5 = (double)lVar7 -
          (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last = dVar5;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total =
       dVar5 + (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total
  ;
  auVar9._0_8_ = dVar8 * 1000.0;
  auVar9._8_8_ = dVar5 * 1000.0;
  dVar5 = (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.tick_frequency_;
  auVar10._8_4_ = SUB84(dVar5,0);
  auVar10._0_8_ = dVar6;
  auVar10._12_4_ = (int)((ulong)dVar5 >> 0x20);
  auVar10 = divpd(auVar9,auVar10);
  return dVar4 + (auVar10._0_8_ - auVar10._8_8_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc((size_t)img_.rows * (((size_t)img_.cols + 1) / 2) + ((size_t)img_.cols + 1) / 2 + 1, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ls_t + ma_t;
    }